

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

float __thiscall
vkt::sr::anon_unknown_0::TextureQueryLodInstance::computeLevelFromLod
          (TextureQueryLodInstance *this,float computedLod)

{
  int in_ESI;
  float fVar1;
  float fVar2;
  
  fVar1 = 0.0;
  if (in_ESI - 2U < 4) {
    fVar2 = (float)((int)this + -1);
    fVar1 = (float)(-(uint)(0.0 < computedLod) &
                   (~-(uint)(fVar2 <= computedLod) & (uint)computedLod |
                   -(uint)(fVar2 <= computedLod) & (uint)fVar2));
    switch(in_ESI) {
    default:
      fVar1 = ceilf(fVar1 + 0.5);
      fVar1 = fVar1 + -1.0;
      return (float)(-(uint)(0.0 < fVar1) &
                    (~-(uint)(fVar2 <= fVar1) & (uint)fVar1 | (uint)fVar2 & -(uint)(fVar2 <= fVar1))
                    );
    case 3:
    case 5:
    }
  }
  return fVar1;
}

Assistant:

float TextureQueryLodInstance::computeLevelFromLod (float computedLod) const
{
	const int	maxAccessibleLevel	= m_textureSpec.numLevels - 1;

	// Clamp the computed LOD to the range of accessible levels.
	computedLod = deFloatClamp(computedLod, 0.0f, (float)maxAccessibleLevel);

	// Return a value according to the min filter.
	switch (m_textureSpec.sampler.minFilter)
	{
		case tcu::Sampler::LINEAR:
		case tcu::Sampler::NEAREST:
			return 0.0f;

		case tcu::Sampler::NEAREST_MIPMAP_NEAREST:
		case tcu::Sampler::LINEAR_MIPMAP_NEAREST:
			return deFloatClamp(deFloatCeil(computedLod + 0.5f) - 1.0f, 0.0f, (float)maxAccessibleLevel);

		case tcu::Sampler::NEAREST_MIPMAP_LINEAR:
		case tcu::Sampler::LINEAR_MIPMAP_LINEAR:
			return computedLod;

		default:
			DE_ASSERT(false);
			return 0.0f;
	}
}